

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void nonce_function_bip340_bitflip
               (uchar **args,size_t n_flip,size_t n_bytes,size_t msglen,size_t algolen)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uchar *key32;
  uchar *keypair;
  void *ndata;
  size_t msglen_00;
  uchar *msg;
  secp256k1_keypair *keypair_00;
  uchar (*nonce32) [32];
  secp256k1_context *input32;
  int iVar5;
  uchar *xonly_pk32;
  uchar *puVar6;
  secp256k1_keypair *psVar7;
  secp256k1_xonly_pubkey *pubkey;
  uchar *algo;
  long lVar8;
  secp256k1_xonly_pubkey sStackY_230;
  uchar *puStackY_1f0;
  uchar *puStackY_1e8;
  uchar *puStackY_1e0;
  code *pcStackY_1d8;
  secp256k1_schnorrsig_extraparams sStack_1c0;
  undefined1 auStack_1a0 [64];
  undefined1 auStack_160 [160];
  byte abStack_c0 [64];
  uchar **ppuStack_80;
  uchar nonces [2] [32];
  
  nonce32 = nonces;
  msg = *args;
  key32 = args[1];
  xonly_pk32 = args[2];
  algo = args[3];
  iVar3 = nonce_function_bip340(nonces[0],msg,0x20,key32,xonly_pk32,algo,0xd,args[4]);
  if (iVar3 == 0) {
    nonce_function_bip340_bitflip_cold_3();
LAB_00169af4:
    nonce_function_bip340_bitflip_cold_2();
  }
  else {
    secp256k1_testrand_flip(args[n_flip],n_bytes);
    nonce32 = nonces + 1;
    msg = *args;
    key32 = args[1];
    xonly_pk32 = args[2];
    algo = args[3];
    lVar8 = 0x20;
    uVar4 = nonce_function_bip340(*nonce32,msg,0x20,key32,xonly_pk32,algo,0xd,args[4]);
    if (uVar4 == 0) goto LAB_00169af4;
    do {
      key32 = (uchar *)(ulong)uVar4;
      bVar1 = nonces[0][lVar8];
      msg = (uchar *)(ulong)bVar1;
      iVar3 = (uint)nonces[-1][lVar8] - (uint)bVar1;
      if (nonces[-1][lVar8] != bVar1) goto LAB_00169ae1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x40);
    iVar3 = 0;
LAB_00169ae1:
    if (iVar3 != 0) {
      return;
    }
  }
  nonce_function_bip340_bitflip_cold_1();
  sStack_1c0.magic[0] = 0xda;
  sStack_1c0.magic[1] = 'o';
  sStack_1c0.magic[2] = 0xb3;
  sStack_1c0.magic[3] = 0x8c;
  sStack_1c0._4_4_ = 0;
  sStack_1c0.noncefp = (secp256k1_nonce_function_hardened)0x0;
  keypair_00 = (secp256k1_keypair *)(auStack_160 + 0x40);
  pcStackY_1d8 = (code *)0x169b45;
  keypair = key32;
  input32 = CTX;
  puVar6 = xonly_pk32;
  ppuStack_80 = args;
  iVar3 = secp256k1_keypair_create(CTX,keypair_00,*nonce32);
  iVar5 = (int)puVar6;
  if (iVar3 == 0) {
    pcStackY_1d8 = (code *)0x169cbf;
    test_schnorrsig_bip_vectors_check_signing_cold_9();
LAB_00169cbf:
    pcStackY_1d8 = (code *)0x169cc4;
    test_schnorrsig_bip_vectors_check_signing_cold_8();
LAB_00169cc4:
    pcStackY_1d8 = (code *)0x169cc9;
    test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_00169cc9:
    pcStackY_1d8 = (code *)0x169cce;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_00169cce:
    pcStackY_1d8 = (code *)0x169cd3;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
LAB_00169cd3:
    pcStackY_1d8 = (code *)0x169cd8;
    test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_00169cd8:
    pcStackY_1d8 = (code *)0x169cdd;
    test_schnorrsig_bip_vectors_check_signing_cold_4();
  }
  else {
    keypair_00 = (secp256k1_keypair *)auStack_1a0;
    psVar7 = (secp256k1_keypair *)(auStack_160 + 0x40);
    pcStackY_1d8 = (code *)0x169b71;
    keypair = xonly_pk32;
    input32 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_custom
                      (CTX,(uchar *)keypair_00,key32,(size_t)xonly_pk32,psVar7,&sStack_1c0);
    iVar5 = (int)psVar7;
    if (iVar3 == 0) goto LAB_00169cbf;
    keypair = (uchar *)0x0;
    do {
      bVar1 = auStack_1a0[(long)keypair];
      keypair_00 = (secp256k1_keypair *)(ulong)bVar1;
      bVar2 = algo[(long)keypair];
      input32 = (secp256k1_context *)(ulong)bVar2;
      iVar3 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00169b9e;
      keypair = keypair + 1;
    } while (keypair != (uchar *)0x40);
    iVar3 = 0;
LAB_00169b9e:
    if (iVar3 != 0) goto LAB_00169cc4;
    if (xonly_pk32 != (uchar *)0x20) {
LAB_00169c1f:
      keypair_00 = (secp256k1_keypair *)abStack_c0;
      pcStackY_1d8 = (code *)0x169c36;
      input32 = CTX;
      iVar3 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_00,msg);
      if (iVar3 == 0) goto LAB_00169cc9;
      keypair_00 = (secp256k1_keypair *)auStack_160;
      keypair = auStack_160 + 0x40;
      pcStackY_1d8 = (code *)0x169c59;
      input32 = CTX;
      iVar3 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)keypair_00,(int *)0x0,
                         (secp256k1_keypair *)keypair);
      if (iVar3 == 0) goto LAB_00169cce;
      keypair = (uchar *)0x0;
      do {
        bVar1 = auStack_160[(long)keypair];
        keypair_00 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = abStack_c0[(long)keypair];
        input32 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00169c85;
        keypair = keypair + 1;
      } while (keypair != (uchar *)0x40);
      iVar3 = 0;
LAB_00169c85:
      if (iVar3 != 0) goto LAB_00169cd3;
      keypair_00 = (secp256k1_keypair *)auStack_1a0;
      pubkey = (secp256k1_xonly_pubkey *)auStack_160;
      pcStackY_1d8 = (code *)0x169ca5;
      keypair = xonly_pk32;
      input32 = CTX;
      iVar3 = secp256k1_schnorrsig_verify(CTX,(uchar *)keypair_00,key32,(size_t)xonly_pk32,pubkey);
      iVar5 = (int)pubkey;
      if (iVar3 != 0) {
        return;
      }
      goto LAB_00169cd8;
    }
    keypair_00 = (secp256k1_keypair *)auStack_1a0;
    auStack_1a0[0x30] = '\0';
    auStack_1a0[0x31] = '\0';
    auStack_1a0[0x32] = '\0';
    auStack_1a0[0x33] = '\0';
    auStack_1a0[0x34] = '\0';
    auStack_1a0[0x35] = '\0';
    auStack_1a0[0x36] = '\0';
    auStack_1a0[0x37] = '\0';
    auStack_1a0[0x38] = '\0';
    auStack_1a0[0x39] = '\0';
    auStack_1a0[0x3a] = '\0';
    auStack_1a0[0x3b] = '\0';
    auStack_1a0[0x3c] = '\0';
    auStack_1a0[0x3d] = '\0';
    auStack_1a0[0x3e] = '\0';
    auStack_1a0[0x3f] = '\0';
    auStack_1a0[0x20] = '\0';
    auStack_1a0[0x21] = '\0';
    auStack_1a0[0x22] = '\0';
    auStack_1a0[0x23] = '\0';
    auStack_1a0[0x24] = '\0';
    auStack_1a0[0x25] = '\0';
    auStack_1a0[0x26] = '\0';
    auStack_1a0[0x27] = '\0';
    auStack_1a0[0x28] = '\0';
    auStack_1a0[0x29] = '\0';
    auStack_1a0[0x2a] = '\0';
    auStack_1a0[0x2b] = '\0';
    auStack_1a0[0x2c] = '\0';
    auStack_1a0[0x2d] = '\0';
    auStack_1a0[0x2e] = '\0';
    auStack_1a0[0x2f] = '\0';
    auStack_1a0[0x10] = '\0';
    auStack_1a0[0x11] = '\0';
    auStack_1a0[0x12] = '\0';
    auStack_1a0[0x13] = '\0';
    auStack_1a0[0x14] = '\0';
    auStack_1a0[0x15] = '\0';
    auStack_1a0[0x16] = '\0';
    auStack_1a0[0x17] = '\0';
    auStack_1a0[0x18] = '\0';
    auStack_1a0[0x19] = '\0';
    auStack_1a0[0x1a] = '\0';
    auStack_1a0[0x1b] = '\0';
    auStack_1a0[0x1c] = '\0';
    auStack_1a0[0x1d] = '\0';
    auStack_1a0[0x1e] = '\0';
    auStack_1a0[0x1f] = '\0';
    auStack_1a0[0] = '\0';
    auStack_1a0[1] = '\0';
    auStack_1a0[2] = '\0';
    auStack_1a0[3] = '\0';
    auStack_1a0[4] = '\0';
    auStack_1a0[5] = '\0';
    auStack_1a0[6] = '\0';
    auStack_1a0[7] = '\0';
    auStack_1a0[8] = '\0';
    auStack_1a0[9] = '\0';
    auStack_1a0[10] = '\0';
    auStack_1a0[0xb] = '\0';
    auStack_1a0[0xc] = '\0';
    auStack_1a0[0xd] = '\0';
    auStack_1a0[0xe] = '\0';
    auStack_1a0[0xf] = '\0';
    psVar7 = (secp256k1_keypair *)(auStack_160 + 0x40);
    keypair = (uchar *)0x20;
    pcStackY_1d8 = (code *)0x169bea;
    input32 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_internal
                      (CTX,(uchar *)keypair_00,key32,0x20,psVar7,nonce_function_bip340,ndata);
    iVar5 = (int)psVar7;
    if (iVar3 != 0) {
      keypair = (uchar *)0x0;
      do {
        bVar1 = auStack_1a0[(long)keypair];
        keypair_00 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = algo[(long)keypair];
        input32 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00169c17;
        keypair = keypair + 1;
      } while (keypair != (uchar *)0x40);
      iVar3 = 0;
LAB_00169c17:
      if (iVar3 != 0) goto LAB_00169ce2;
      goto LAB_00169c1f;
    }
  }
  pcStackY_1d8 = (code *)0x169ce2;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_00169ce2:
  pcStackY_1d8 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  puStackY_1f0 = xonly_pk32;
  puStackY_1e8 = algo;
  puStackY_1e0 = key32;
  pcStackY_1d8 = (code *)msg;
  iVar3 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_230,(uchar *)input32);
  if (iVar3 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar3 = secp256k1_schnorrsig_verify(CTX,keypair,keypair_00->data,msglen_00,&sStackY_230);
    if (iVar3 == iVar5) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void nonce_function_bip340_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes, size_t msglen, size_t algolen) {
    unsigned char nonces[2][32];
    CHECK(nonce_function_bip340(nonces[0], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    secp256k1_testrand_flip(args[n_flip], n_bytes);
    CHECK(nonce_function_bip340(nonces[1], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    CHECK(secp256k1_memcmp_var(nonces[0], nonces[1], 32) != 0);
}